

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O2

void Assimp::SceneCombiner::Copy(aiMetadata **_dest,aiMetadata *src)

{
  uint uVar1;
  aiMetadataEntry *paVar2;
  uint *puVar3;
  undefined8 *puVar4;
  aiMetadata *paVar5;
  aiMetadataEntry *paVar6;
  uint *puVar7;
  long lVar8;
  uint i;
  ulong uVar9;
  
  if ((src != (aiMetadata *)0x0 && _dest != (aiMetadata **)0x0) && (src->mNumProperties != 0)) {
    paVar5 = aiMetadata::Alloc(src->mNumProperties);
    *_dest = paVar5;
    std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<aiString*,aiString*>
              (src->mKeys,src->mKeys + src->mNumProperties,paVar5->mKeys);
    paVar6 = (aiMetadataEntry *)operator_new__((ulong)src->mNumProperties << 4);
    paVar5->mValues = paVar6;
    lVar8 = 0;
    for (uVar9 = 0; uVar9 < src->mNumProperties; uVar9 = uVar9 + 1) {
      paVar6 = src->mValues;
      paVar2 = paVar5->mValues;
      *(undefined4 *)((long)&paVar2->mType + lVar8) = *(undefined4 *)((long)&paVar6->mType + lVar8);
      switch(*(undefined4 *)((long)&paVar5->mValues->mType + lVar8)) {
      case 0:
        puVar7 = (uint *)operator_new(1);
        *(undefined1 *)puVar7 = **(undefined1 **)((long)&paVar6->mData + lVar8);
        break;
      case 1:
        puVar7 = (uint *)operator_new(4);
        *puVar7 = **(uint **)((long)&paVar6->mData + lVar8);
        break;
      case 2:
        puVar7 = (uint *)operator_new(8);
        *(undefined8 *)puVar7 = **(undefined8 **)((long)&paVar6->mData + lVar8);
        break;
      case 3:
        puVar7 = (uint *)operator_new(4);
        *puVar7 = **(uint **)((long)&paVar6->mData + lVar8);
        break;
      case 4:
        puVar7 = (uint *)operator_new(8);
        *(undefined8 *)puVar7 = **(undefined8 **)((long)&paVar6->mData + lVar8);
        break;
      case 5:
        puVar7 = (uint *)operator_new(0x404);
        puVar3 = *(uint **)((long)&paVar6->mData + lVar8);
        uVar1 = *puVar3;
        if (0x3fe < uVar1) {
          uVar1 = 0x3ff;
        }
        *puVar7 = uVar1;
        memcpy(puVar7 + 1,puVar3 + 1,(ulong)uVar1);
        *(undefined1 *)((long)puVar7 + (ulong)uVar1 + 4) = 0;
        break;
      case 6:
        puVar7 = (uint *)operator_new(0xc);
        puVar4 = *(undefined8 **)((long)&paVar6->mData + lVar8);
        *(undefined8 *)puVar7 = *puVar4;
        puVar7[2] = *(uint *)(puVar4 + 1);
        break;
      default:
        goto switchD_003adb48_default;
      }
      *(uint **)((long)&paVar2->mData + lVar8) = puVar7;
switchD_003adb48_default:
      lVar8 = lVar8 + 0x10;
    }
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiMetadata** _dest, const aiMetadata* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    if ( 0 == src->mNumProperties ) {
        return;
    }

    aiMetadata* dest = *_dest = aiMetadata::Alloc( src->mNumProperties );
    std::copy(src->mKeys, src->mKeys + src->mNumProperties, dest->mKeys);

    dest->mValues = new aiMetadataEntry[src->mNumProperties];
    for (unsigned int i = 0; i < src->mNumProperties; ++i) {
        aiMetadataEntry& in = src->mValues[i];
        aiMetadataEntry& out = dest->mValues[i];
        out.mType = in.mType;
        switch (dest->mValues[i].mType) {
            case AI_BOOL:
                out.mData = new bool(*static_cast<bool*>(in.mData));
                break;
            case AI_INT32:
                out.mData = new int32_t(*static_cast<int32_t*>(in.mData));
                break;
            case AI_UINT64:
                out.mData = new uint64_t(*static_cast<uint64_t*>(in.mData));
                break;
            case AI_FLOAT:
                out.mData = new float(*static_cast<float*>(in.mData));
                break;
            case AI_DOUBLE:
                out.mData = new double(*static_cast<double*>(in.mData));
                break;
            case AI_AISTRING:
                out.mData = new aiString(*static_cast<aiString*>(in.mData));
                break;
            case AI_AIVECTOR3D:
                out.mData = new aiVector3D(*static_cast<aiVector3D*>(in.mData));
                break;
            default:
                ai_assert(false);
                break;
        }
    }
}